

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_list.cpp
# Opt level: O0

RK_S32 __thiscall mpp_list::fifo_rd(mpp_list *this,void *data,RK_S32 *size)

{
  mpp_list_node *node_00;
  mpp_list_node *node;
  RK_S32 ret;
  RK_S32 *size_local;
  void *data_local;
  mpp_list *this_local;
  
  node._4_4_ = -0x16;
  if ((this->head != (mpp_list_node *)0x0) && (this->count != 0)) {
    node_00 = this->head->next;
    mpp_list_del_init(node_00);
    release_list_with_size(node_00,data,size);
    this->count = this->count + -1;
    node._4_4_ = 0;
  }
  return node._4_4_;
}

Assistant:

RK_S32 mpp_list::fifo_rd(void *data, RK_S32 *size)
{
    RK_S32 ret = -EINVAL;
    if (head && count) {
        mpp_list_node *node = head->next;

        mpp_list_del_init(node);
        release_list_with_size(node, data, size);
        count--;
        ret = 0;
    }
    return ret;
}